

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# layout.c++
# Opt level: O3

SegmentAnd<capnp::word_*>
capnp::_::WireHelpers::copyPointer
          (SegmentBuilder *dstSegment,CapTableBuilder *dstCapTable,WirePointer *dst,
          SegmentReader *srcSegment,CapTableReader *srcCapTable,WirePointer *src,word *srcTarget,
          int nestingLimit,BuilderArena *orphanArena,bool canonical)

{
  ushort uVar1;
  Arena *pAVar2;
  ulong uVar3;
  WireHelpers *this;
  ReadLimiter *pRVar4;
  StructReader value;
  ListReader value_00;
  ClientHook *pCVar5;
  int iVar6;
  undefined4 extraout_var;
  undefined4 extraout_var_00;
  ulong uVar7;
  uint uVar8;
  word *pwVar9;
  uint uVar10;
  long lVar11;
  byte bVar12;
  ulong uVar13;
  ulong uVar14;
  uint uVar15;
  WirePointer *pWVar16;
  SegmentAnd<capnp::word_*> SVar17;
  Fault f;
  Fault f_2;
  undefined8 uVar18;
  undefined8 uVar19;
  Own<capnp::ClientHook> local_e8;
  CapTableReader *local_d8;
  SegmentReader *local_d0;
  CapTableReader *pCStack_c8;
  WirePointer *local_c0;
  uint uStack_b8;
  uint uStack_b4;
  int local_b0;
  ushort uStack_ac;
  byte bStack_aa;
  undefined1 uStack_a9;
  int iStack_a8;
  undefined4 uStack_a4;
  SegmentReader *local_a0;
  CapTableReader *pCStack_98;
  WirePointer *local_90;
  uint uStack_88;
  int iStack_84;
  int local_80;
  ushort uStack_7c;
  undefined1 uStack_7a;
  undefined1 uStack_79;
  int iStack_78;
  undefined4 uStack_74;
  SegmentReader *local_70;
  CapTableReader *pCStack_68;
  WirePointer *local_60;
  WirePointer *pWStack_58;
  int local_50;
  ushort uStack_4c;
  undefined2 uStack_4a;
  int iStack_48;
  undefined4 uStack_44;
  Fault local_40;
  ClientHook *local_38;
  
  uVar8 = (src->offsetAndKind).value;
  if ((src->field_1).upper32Bits != 0 || uVar8 != 0) {
    if (srcSegment == (SegmentReader *)0x0) {
      srcSegment = (SegmentReader *)0x0;
LAB_001fdeb0:
      pWVar16 = src;
      if ((WirePointer *)srcTarget != (WirePointer *)0x0) {
LAB_001fdebc:
        uVar8 = (uint)*(uint64_t *)&(pWVar16->offsetAndKind).value;
        switch(uVar8 & 3) {
        case 0:
          goto switchD_001fded2_caseD_0;
        case 1:
switchD_001fded2_caseD_1:
          local_d8 = srcCapTable;
          if (nestingLimit < 1) {
            copyPointer();
          }
          else {
            uVar8 = (pWVar16->field_1).upper32Bits;
            bVar12 = (byte)uVar8 & 7;
            if (bVar12 == 7) {
              uVar8 = uVar8 >> 3;
              if (srcSegment == (SegmentReader *)0x0) {
LAB_001fe068:
                uVar10 = (uint)*(uint64_t *)&(((WirePointer *)srcTarget)->offsetAndKind).value;
                if ((uVar10 & 3) == 0) {
                  uVar10 = uVar10 >> 2;
                  uStack_88 = uVar10 & 0x1fffffff;
                  uVar13 = (ulong)uStack_88;
                  uVar1 = *(ushort *)&((WirePointer *)srcTarget)->field_1;
                  uStack_7c = *(ushort *)((long)&((WirePointer *)srcTarget)->field_1 + 2);
                  uVar15 = (uint)uStack_7c + (uint)uVar1;
                  if (uVar15 * uVar13 < (ulong)uVar8 || uVar15 * uVar13 - (ulong)uVar8 == 0) {
                    local_a0 = (SegmentReader *)0x0;
                    if (uVar15 != 0) {
                      local_a0 = srcSegment;
                    }
                    if ((srcSegment != (SegmentReader *)0x0) && (uVar15 == 0)) {
                      uVar7 = srcSegment->readLimiter->limit;
                      if (uVar7 < uVar13) {
                        copyPointer((WireHelpers *)srcSegment->arena);
                        break;
                      }
                      srcSegment->readLimiter->limit = uVar7 - uVar13;
                      local_a0 = srcSegment;
                    }
                    srcTarget = (word *)((WirePointer *)srcTarget + 1);
                    iStack_84 = uVar15 * 0x40;
                    local_80 = (uint)uVar1 << 6;
                    iStack_78 = nestingLimit + -1;
                    uStack_7a = 7;
                    uVar13 = CONCAT44(iStack_84,uVar10) & 0xffffffff1fffffff;
                    uVar18 = CONCAT17(uStack_79,CONCAT16(7,CONCAT24(uStack_7c,local_80)));
                    uVar19 = CONCAT44(uStack_74,iStack_78);
                    srcSegment = local_a0;
                    pCStack_98 = srcCapTable;
                    local_90 = (WirePointer *)srcTarget;
                    goto LAB_001fe3cb;
                  }
                  copyPointer();
                }
                else {
                  copyPointer();
                }
              }
              else {
                if (((long)srcTarget - (long)(srcSegment->ptr).ptr >> 3) + (ulong)uVar8 + 1 <=
                    (srcSegment->ptr).size_) {
                  uVar13 = (ulong)uVar8 + 1;
                  uVar7 = srcSegment->readLimiter->limit;
                  if (uVar13 <= uVar7) {
                    srcSegment->readLimiter->limit = uVar7 - uVar13;
                    goto LAB_001fe068;
                  }
                  (*srcSegment->arena->_vptr_Arena[3])();
                }
                copyPointer();
              }
            }
            else {
              local_b0 = *(int *)(BITS_PER_ELEMENT_TABLE + ((ulong)uVar8 & 7) * 4);
              uStack_b4 = (uint)(bVar12 == 6) * 0x40 + local_b0;
              uStack_b8 = uVar8 >> 3;
              uVar13 = (ulong)uStack_b8;
              bStack_aa = bVar12;
              if (srcSegment == (SegmentReader *)0x0) {
                if ((uVar8 & 7) == 0) {
LAB_001fe364:
                  bStack_aa = 0;
                }
LAB_001fe366:
                iStack_a8 = nestingLimit + -1;
                uStack_ac = (ushort)(bVar12 == 6);
                uVar13 = CONCAT44(uStack_b4,uStack_b8);
                uVar18 = CONCAT17(uStack_a9,
                                  CONCAT16(bStack_aa,(uint6)CONCAT14(bVar12 == 6,local_b0)));
                uVar19 = CONCAT44(uStack_a4,iStack_a8);
                local_d0 = srcSegment;
                pCStack_c8 = srcCapTable;
                local_c0 = (WirePointer *)srcTarget;
LAB_001fe3cb:
                value_00.capTable = srcCapTable;
                value_00.segment = srcSegment;
                value_00.ptr = (byte *)srcTarget;
                value_00.elementCount = (int)uVar13;
                value_00.step = (int)(uVar13 >> 0x20);
                value_00.structDataSize = (int)uVar18;
                value_00.structPointerCount = (short)((ulong)uVar18 >> 0x20);
                value_00.elementSize = (char)((ulong)uVar18 >> 0x30);
                value_00._39_1_ = (char)((ulong)uVar18 >> 0x38);
                value_00._40_8_ = uVar19;
                SVar17 = setListPointer(dstSegment,dstCapTable,dst,value_00,orphanArena,canonical);
                goto LAB_001fe3dc;
              }
              uVar7 = uStack_b4 * uVar13 + 0x3f >> 6 & 0xffffffff;
              if (((long)srcTarget - (long)(srcSegment->ptr).ptr >> 3) + uVar7 <=
                  (srcSegment->ptr).size_) {
                this = (WireHelpers *)srcSegment->arena;
                pRVar4 = srcSegment->readLimiter;
                if (uVar7 <= pRVar4->limit) {
                  pRVar4->limit = pRVar4->limit - uVar7;
                  if ((uVar8 & 7) == 0) {
                    if (pRVar4->limit < uVar13) {
                      copyPointer(this);
                      break;
                    }
                    pRVar4->limit = pRVar4->limit - uVar13;
                    goto LAB_001fe364;
                  }
                  goto LAB_001fe366;
                }
                (**(code **)(*(long *)this + 0x18))();
              }
              copyPointer();
            }
          }
          break;
        case 2:
switchD_001fded2_caseD_2:
          kj::_::Debug::Fault::Fault<kj::Exception::Type,char_const(&)[24]>
                    ((Fault *)&local_e8,
                     "/workspace/llm4binary/github/license_all_cmakelists_25/Cosmic-Sans[P]capnproto/c++/src/capnp/layout.c++"
                     ,0x7fe,FAILED,(char *)0x0,"\"Unexpected FAR pointer.\"",
                     (char (*) [24])"Unexpected FAR pointer.");
          kj::_::Debug::Fault::~Fault((Fault *)&local_e8);
          break;
        case 3:
switchD_001fded2_caseD_3:
          if (uVar8 == 3) {
            if (canonical) {
              kj::_::Debug::Fault::Fault<kj::Exception::Type,char_const(&)[52]>
                        ((Fault *)&local_e8,
                         "/workspace/llm4binary/github/license_all_cmakelists_25/Cosmic-Sans[P]capnproto/c++/src/capnp/layout.c++"
                         ,0x808,FAILED,(char *)0x0,
                         "\"Cannot create a canonical message with a capability\"",
                         (char (*) [52])"Cannot create a canonical message with a capability");
              kj::_::Debug::Fault::~Fault((Fault *)&local_e8);
            }
            (**srcCapTable->_vptr_CapTableReader)
                      (&local_40,srcCapTable,(ulong)(pWVar16->field_1).upper32Bits);
            local_e8.disposer = (Disposer *)local_40.exception;
            local_e8.ptr = local_38;
            if (local_38 != (ClientHook *)0x0) {
              setCapabilityPointer(dstSegment,dstCapTable,dst,&local_e8);
              pCVar5 = local_e8.ptr;
              if (local_e8.ptr != (ClientHook *)0x0) {
                local_e8.ptr = (ClientHook *)0x0;
                (**(_func_int **)(((String *)&(local_e8.disposer)->_vptr_Disposer)->content).ptr)
                          (local_e8.disposer,
                           pCVar5->_vptr_ClientHook[-2] + (long)&pCVar5->_vptr_ClientHook);
              }
              pwVar9 = (word *)0x1;
              goto LAB_001fe3df;
            }
            kj::_::Debug::Fault::Fault<kj::Exception::Type,char_const(&)[46]>
                      (&local_40,
                       "/workspace/llm4binary/github/license_all_cmakelists_25/Cosmic-Sans[P]capnproto/c++/src/capnp/layout.c++"
                       ,0x813,FAILED,(char *)0x0,"\"Message contained invalid capability pointer.\""
                       ,(char (*) [46])"Message contained invalid capability pointer.");
            kj::_::Debug::Fault::~Fault(&local_40);
          }
          else {
            copyPointer();
          }
        }
      }
    }
    else {
      if ((uVar8 & 3) != 2) goto LAB_001fdeb0;
      iVar6 = (*srcSegment->arena->_vptr_Arena[2])();
      srcSegment = (SegmentReader *)CONCAT44(extraout_var,iVar6);
      if (srcSegment == (SegmentReader *)0x0) {
        copyPointer();
        goto LAB_001fe320;
      }
      uVar13 = (srcSegment->ptr).size_;
      uVar8 = (src->offsetAndKind).value;
      uVar7 = (ulong)(uVar8 >> 3);
      if ((long)uVar13 < (long)(ulong)(uVar8 >> 3)) {
        uVar7 = uVar13;
      }
      uVar14 = 2 - (ulong)((uVar8 & 4) == 0);
      if (uVar13 < uVar7 + uVar14) {
LAB_001fe401:
        copyPointer();
        goto LAB_001fe320;
      }
      pwVar9 = (srcSegment->ptr).ptr;
      pAVar2 = srcSegment->arena;
      uVar3 = srcSegment->readLimiter->limit;
      if (uVar3 < uVar14) {
        (*pAVar2->_vptr_Arena[3])();
        goto LAB_001fe401;
      }
      pWVar16 = (WirePointer *)(pwVar9 + uVar7);
      src = pWVar16 + 1;
      srcSegment->readLimiter->limit = uVar3 - uVar14;
      if ((uVar8 & 4) != 0) {
        iVar6 = (*pAVar2->_vptr_Arena[2])(pAVar2,(ulong)(pWVar16->field_1).upper32Bits);
        srcSegment = (SegmentReader *)CONCAT44(extraout_var_00,iVar6);
        if (srcSegment == (SegmentReader *)0x0) {
          copyPointer();
        }
        else {
          uVar8 = (uint)*(uint64_t *)&(pWVar16->offsetAndKind).value;
          if ((uVar8 & 3) == 2) {
            uVar7 = (ulong)(uVar8 >> 3);
            uVar13 = (srcSegment->ptr).size_;
            if ((long)uVar13 < (long)uVar7) {
              uVar7 = uVar13;
            }
            srcTarget = (srcSegment->ptr).ptr + uVar7;
            goto LAB_001fdeb0;
          }
          copyPointer();
        }
        goto LAB_001fe320;
      }
      uVar8 = (uint)*(uint64_t *)&(pWVar16->offsetAndKind).value;
      lVar11 = (long)((int)uVar8 >> 2);
      srcTarget = pwVar9 + uVar13;
      if ((lVar11 < (long)pwVar9 - (long)src >> 3) || ((long)srcTarget - (long)src >> 3 < lVar11))
      goto LAB_001fdebc;
      srcTarget = (word *)(src + lVar11);
      switch(uVar8 & 3) {
      case 1:
        goto switchD_001fded2_caseD_1;
      case 2:
        goto switchD_001fded2_caseD_2;
      case 3:
        goto switchD_001fded2_caseD_3;
      }
switchD_001fded2_caseD_0:
      if (nestingLimit < 1) {
        copyPointer();
      }
      else {
        uVar1 = *(ushort *)&pWVar16->field_1;
        uStack_4c = *(ushort *)((long)&pWVar16->field_1 + 2);
        if (srcSegment == (SegmentReader *)0x0) {
LAB_001fdf2d:
          pWStack_58 = (WirePointer *)srcTarget + uVar1;
          local_50 = (uint)uVar1 << 6;
          iStack_48 = nestingLimit + -1;
          value.pointerCount = uStack_4c;
          value.dataSize = local_50;
          value._38_2_ = uStack_4a;
          value._44_4_ = uStack_44;
          value.nestingLimit = iStack_48;
          value.capTable = srcCapTable;
          value.segment = srcSegment;
          value.data = srcTarget;
          value.pointers = pWStack_58;
          local_70 = srcSegment;
          pCStack_68 = srcCapTable;
          local_60 = (WirePointer *)srcTarget;
          SVar17 = setStructPointer(dstSegment,dstCapTable,dst,value,orphanArena,canonical);
LAB_001fe3dc:
          pwVar9 = SVar17.value;
          dstSegment = SVar17.segment;
          goto LAB_001fe3df;
        }
        uVar13 = (ulong)uStack_4c + (ulong)uVar1;
        if (((long)srcTarget - (long)(srcSegment->ptr).ptr >> 3) + uVar13 <= (srcSegment->ptr).size_
           ) {
          uVar7 = srcSegment->readLimiter->limit;
          if (uVar13 <= uVar7) {
            srcSegment->readLimiter->limit = uVar7 - uVar13;
            goto LAB_001fdf2d;
          }
          (*srcSegment->arena->_vptr_Arena[3])();
        }
        copyPointer();
      }
    }
  }
LAB_001fe320:
  if ((dst->field_1).upper32Bits != 0 || (dst->offsetAndKind).value != 0) {
    zeroObject(dstSegment,dstCapTable,dst);
    dst->offsetAndKind = 0;
    dst->field_1 = (anon_union_4_5_35ddcec3_for_WirePointer_1)0x0;
  }
  pwVar9 = (word *)0x0;
LAB_001fe3df:
  SVar17.value = pwVar9;
  SVar17.segment = dstSegment;
  return SVar17;
}

Assistant:

static SegmentAnd<word*> copyPointer(
      SegmentBuilder* dstSegment, CapTableBuilder* dstCapTable, WirePointer* dst,
      SegmentReader* srcSegment, CapTableReader* srcCapTable, const WirePointer* src,
      const word* srcTarget, int nestingLimit,
      BuilderArena* orphanArena = nullptr, bool canonical = false) {
    // Deep-copy the object pointed to by src into dst.  It turns out we can't reuse
    // readStructPointer(), etc. because they do type checking whereas here we want to accept any
    // valid pointer.

    if (src->isNull()) {
    useDefault:
      if (!dst->isNull()) {
        zeroObject(dstSegment, dstCapTable, dst);
        zeroMemory(dst);
      }
      return { dstSegment, nullptr };
    }

    const word* ptr;
    KJ_IF_MAYBE(p, WireHelpers::followFars(src, srcTarget, srcSegment)) {
      ptr = p;
    } else {
      goto useDefault;
    }

    switch (src->kind()) {
      case WirePointer::STRUCT:
        KJ_REQUIRE(nestingLimit > 0,
              "Message is too deeply-nested or contains cycles.  See capnp::ReaderOptions.") {
          goto useDefault;
        }

        KJ_REQUIRE(boundsCheck(srcSegment, ptr, src->structRef.wordSize()),
                   "Message contained out-of-bounds struct pointer.") {
          goto useDefault;
        }
        return setStructPointer(dstSegment, dstCapTable, dst,
            StructReader(srcSegment, srcCapTable, ptr,
                         reinterpret_cast<const WirePointer*>(ptr + src->structRef.dataSize.get()),
                         src->structRef.dataSize.get() * BITS_PER_WORD,
                         src->structRef.ptrCount.get(),
                         nestingLimit - 1),
            orphanArena, canonical);

      case WirePointer::LIST: {
        ElementSize elementSize = src->listRef.elementSize();

        KJ_REQUIRE(nestingLimit > 0,
              "Message is too deeply-nested or contains cycles.  See capnp::ReaderOptions.") {
          goto useDefault;
        }

        if (elementSize == ElementSize::INLINE_COMPOSITE) {
          auto wordCount = src->listRef.inlineCompositeWordCount();
          const WirePointer* tag = reinterpret_cast<const WirePointer*>(ptr);

          KJ_REQUIRE(boundsCheck(srcSegment, ptr, wordCount + POINTER_SIZE_IN_WORDS),
                     "Message contains out-of-bounds list pointer.") {
            goto useDefault;
          }

          ptr += POINTER_SIZE_IN_WORDS;

          KJ_REQUIRE(tag->kind() == WirePointer::STRUCT,
                     "INLINE_COMPOSITE lists of non-STRUCT type are not supported.") {
            goto useDefault;
          }

          auto elementCount = tag->inlineCompositeListElementCount();
          auto wordsPerElement = tag->structRef.wordSize() / ELEMENTS;

          KJ_REQUIRE(wordsPerElement * upgradeBound<uint64_t>(elementCount) <= wordCount,
                     "INLINE_COMPOSITE list's elements overrun its word count.") {
            goto useDefault;
          }

          if (wordsPerElement * (ONE * ELEMENTS) == ZERO * WORDS) {
            // Watch out for lists of zero-sized structs, which can claim to be arbitrarily large
            // without having sent actual data.
            KJ_REQUIRE(amplifiedRead(srcSegment, elementCount * (ONE * WORDS / ELEMENTS)),
                       "Message contains amplified list pointer.") {
              goto useDefault;
            }
          }

          return setListPointer(dstSegment, dstCapTable, dst,
              ListReader(srcSegment, srcCapTable, ptr,
                         elementCount, wordsPerElement * BITS_PER_WORD,
                         tag->structRef.dataSize.get() * BITS_PER_WORD,
                         tag->structRef.ptrCount.get(), ElementSize::INLINE_COMPOSITE,
                         nestingLimit - 1),
              orphanArena, canonical);
        } else {
          auto dataSize = dataBitsPerElement(elementSize) * ELEMENTS;
          auto pointerCount = pointersPerElement(elementSize) * ELEMENTS;
          auto step = (dataSize + pointerCount * BITS_PER_POINTER) / ELEMENTS;
          auto elementCount = src->listRef.elementCount();
          auto wordCount = roundBitsUpToWords(upgradeBound<uint64_t>(elementCount) * step);

          KJ_REQUIRE(boundsCheck(srcSegment, ptr, wordCount),
                     "Message contains out-of-bounds list pointer.") {
            goto useDefault;
          }

          if (elementSize == ElementSize::VOID) {
            // Watch out for lists of void, which can claim to be arbitrarily large without having
            // sent actual data.
            KJ_REQUIRE(amplifiedRead(srcSegment, elementCount * (ONE * WORDS / ELEMENTS)),
                       "Message contains amplified list pointer.") {
              goto useDefault;
            }
          }

          return setListPointer(dstSegment, dstCapTable, dst,
              ListReader(srcSegment, srcCapTable, ptr, elementCount, step, dataSize, pointerCount,
                         elementSize, nestingLimit - 1),
              orphanArena, canonical);
        }
      }

      case WirePointer::FAR:
        KJ_FAIL_REQUIRE("Unexpected FAR pointer.") {
          goto useDefault;
        }

      case WirePointer::OTHER: {
        KJ_REQUIRE(src->isCapability(), "Unknown pointer type.") {
          goto useDefault;
        }

        if (canonical) {
          KJ_FAIL_REQUIRE("Cannot create a canonical message with a capability") {
            break;
          }
        }
#if !CAPNP_LITE
        KJ_IF_MAYBE(cap, srcCapTable->extractCap(src->capRef.index.get())) {
          setCapabilityPointer(dstSegment, dstCapTable, dst, kj::mv(*cap));
          // Return dummy non-null pointer so OrphanBuilder doesn't end up null.
          return { dstSegment, reinterpret_cast<word*>(1) };
        } else {
#endif  // !CAPNP_LITE
          KJ_FAIL_REQUIRE("Message contained invalid capability pointer.") {
            goto useDefault;
          }
#if !CAPNP_LITE
        }
#endif  // !CAPNP_LITE
      }
    }

    KJ_UNREACHABLE;
  }